

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::SampleDiscrete
          (CompositeCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  element_type *this_00;
  size_type sVar4;
  iterator __last;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_68;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_60;
  size_type local_58;
  size_t cnt_1;
  CurveEntry *entry;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
  *__range3;
  size_t cnt;
  IfcFloat b_local;
  IfcFloat a_local;
  TempMesh *out_local;
  CompositeCurve *this_local;
  
  bVar1 = Curve::InRange((Curve *)this,a);
  if (!bVar1) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x119,
                  "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar1 = Curve::InRange((Curve *)this,b);
  if (!bVar1) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x11a,
                  "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  iVar2 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[6])(a,b);
  sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(&out->mVerts);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&out->mVerts,sVar3 + CONCAT44(extraout_var,iVar2));
  __end3 = std::
           vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ::begin(&this->curves);
  entry = (CurveEntry *)
          std::
          vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
          ::end(&this->curves);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
                                *)&entry);
    if (!bVar1) break;
    cnt_1 = (size_t)__gnu_cxx::
                    __normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
                    ::operator*(&__end3);
    local_58 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                         (&out->mVerts);
    this_00 = std::
              __shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)cnt_1);
    BoundedCurve::SampleDiscrete(this_00,out);
    sVar3 = local_58;
    if ((*(byte *)(cnt_1 + 0x10) & 1) == 0) {
      sVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        (&out->mVerts);
      if (sVar3 != sVar4) {
        local_68._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&out->mVerts);
        local_60 = __gnu_cxx::
                   __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                   ::operator+(&local_68,local_58);
        __last = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                           (&out->mVerts);
        std::
        reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  (local_60,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                             )__last._M_current);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_*,_std::vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        const size_t cnt = EstimateSampleCount(a,b);
        out.mVerts.reserve(out.mVerts.size() + cnt);

        for(const CurveEntry& entry : curves) {
            const size_t cnt = out.mVerts.size();
            entry.first->SampleDiscrete(out);

            if (!entry.second && cnt != out.mVerts.size()) {
                std::reverse(out.mVerts.begin()+cnt,out.mVerts.end());
            }
        }
    }